

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllTypes.cpp
# Opt level: O0

void __thiscall
slang::ast::ForwardingTypedefSymbol::serializeTo
          (ForwardingTypedefSymbol *this,ASTSerializer *serializer)

{
  ASTSerializer *in_RSI;
  char *in_RDI;
  string_view sVar1;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffffc0;
  void *local_38;
  size_t local_30;
  int local_20;
  void *local_18;
  
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (in_stack_ffffffffffffffc0,in_RDI);
  sVar1 = ast::toString(None);
  local_30 = sVar1._M_len;
  ASTSerializer::write(in_RSI,local_20,local_18,local_30);
  if (*(long *)(in_RDI + 0x50) != 0) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_ffffffffffffffc0,in_RDI);
    ASTSerializer::write(in_RSI,(int)in_stack_ffffffffffffffc0,local_38,*(size_t *)(in_RDI + 0x50));
  }
  return;
}

Assistant:

void ForwardingTypedefSymbol::serializeTo(ASTSerializer& serializer) const {
    serializer.write("category", toString(typeRestriction));
    if (next)
        serializer.write("next", *next);
}